

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis-read.c
# Opt level: O2

int vorbis_unpack_id_hdr(vorbis_stream_t *vorbis)

{
  uchar *puVar1;
  uint uVar2;
  unsigned_long uVar3;
  char *__assertion;
  uchar *ptr;
  bv_t bv;
  
  if (vorbis == (vorbis_stream_t *)0x0) {
    __assertion = "vorbis != NULL";
    uVar2 = 0x22;
  }
  else {
    puVar1 = (vorbis->id_hdr).data;
    if (puVar1 == (uchar *)0x0) {
      __assertion = "vorbis->id_hdr.data != NULL";
      uVar2 = 0x23;
    }
    else {
      if ((vorbis->id_hdr).len == 0x1e) {
        ptr = puVar1 + 7;
        uVar2 = le_uint32_unpack__(&ptr);
        vorbis->vorbis_version = (ulong)uVar2;
        vorbis->audio_channels = *ptr;
        ptr = ptr + 1;
        uVar2 = le_uint32_unpack__(&ptr);
        vorbis->audio_sample_rate = (ulong)uVar2;
        uVar2 = le_uint32_unpack__(&ptr);
        vorbis->bitrate_maximum = (ulong)uVar2;
        uVar2 = le_uint32_unpack__(&ptr);
        vorbis->bitrate_nominal = (ulong)uVar2;
        uVar2 = le_uint32_unpack__(&ptr);
        vorbis->bitrate_minimum = (ulong)uVar2;
        bv_init(&bv,ptr,8);
        uVar3 = bv_get_bits(&bv,4);
        vorbis->blocksize_1 = (uchar)uVar3;
        uVar3 = bv_get_bits(&bv,4);
        vorbis->blocksize_0 = (uchar)uVar3;
        uVar2 = 0;
        if (((vorbis->vorbis_version == 0) && (vorbis->audio_channels != '\0')) &&
           (vorbis->audio_sample_rate != 0)) {
          uVar2 = (uint)(((uint)uVar3 & 0xff) <= (uint)vorbis->blocksize_1);
        }
        return uVar2;
      }
      __assertion = "vorbis->id_hdr.len == VORBIS_ID_HDR_SIZE";
      uVar2 = 0x24;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",uVar2,
                "int vorbis_unpack_id_hdr(vorbis_stream_t *)");
}

Assistant:

int vorbis_unpack_id_hdr(vorbis_stream_t *vorbis) {
  assert(vorbis != NULL);
  assert(vorbis->id_hdr.data != NULL);
  assert(vorbis->id_hdr.len == VORBIS_ID_HDR_SIZE);
  
  unsigned char *ptr = vorbis->id_hdr.data + VORBIS_HDR_SIZE;
  vorbis->vorbis_version = LE_UINT32_UNPACK(ptr);
  vorbis->audio_channels = UINT8_UNPACK(ptr);
  vorbis->audio_sample_rate = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_maximum = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_nominal = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_minimum = LE_UINT32_UNPACK(ptr);

  bv_t bv;
  bv_init(&bv, ptr, 8);
  vorbis->blocksize_1 = bv_get_bits(&bv, 4);
  vorbis->blocksize_0 = bv_get_bits(&bv, 4);

#ifdef DEBUG
  vorbis_stream_print(vorbis);
#endif /* DEBUG */

  if ((vorbis->vorbis_version != 0) ||
      (vorbis->audio_channels == 0) ||
      (vorbis->audio_sample_rate == 0) ||
      (vorbis->blocksize_0 > vorbis->blocksize_1))
    return 0;

  return 1;
}